

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O1

xmlXIncludeCtxtPtr xmlXIncludeNewContext(xmlDocPtr doc)

{
  xmlXIncludeCtxtPtr __s;
  
  if ((doc != (xmlDocPtr)0x0) &&
     (__s = (xmlXIncludeCtxtPtr)(*xmlMalloc)(0x88), __s != (xmlXIncludeCtxtPtr)0x0)) {
    memset(__s,0,0x88);
    __s->doc = doc;
    __s->nbErrors = 0;
    __s->incNr = 0;
    __s->incMax = 0;
    __s->incTab = (xmlXIncludeRefPtr *)0x0;
    return __s;
  }
  return (xmlXIncludeCtxtPtr)0x0;
}

Assistant:

xmlXIncludeCtxtPtr
xmlXIncludeNewContext(xmlDocPtr doc) {
    xmlXIncludeCtxtPtr ret;

    if (doc == NULL)
	return(NULL);
    ret = (xmlXIncludeCtxtPtr) xmlMalloc(sizeof(xmlXIncludeCtxt));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlXIncludeCtxt));
    ret->doc = doc;
    ret->incNr = 0;
    ret->incMax = 0;
    ret->incTab = NULL;
    ret->nbErrors = 0;
    return(ret);
}